

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O0

ulong __thiscall nuraft::inmem_log_store::append(inmem_log_store *this,ptr<log_entry> *entry)

{
  key_type *__k;
  size_type sVar1;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *this_00;
  __int_type _Var2;
  EventAwaiter *this_01;
  mapped_type *pmVar3;
  long in_RDI;
  uint64_t cur_time;
  size_t idx;
  lock_guard<std::mutex> l;
  ptr<log_entry> clone;
  mutex_type *in_stack_ffffffffffffff58;
  shared_ptr<nuraft::log_entry> *in_stack_ffffffffffffff60;
  __atomic_base<unsigned_long> *this_02;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffff68;
  __atomic_base<unsigned_long> *p_Var4;
  map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
  *in_stack_ffffffffffffffa0;
  ptr<log_entry> *in_stack_ffffffffffffffb8;
  
  make_clone(in_stack_ffffffffffffffb8);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  __k = (key_type *)std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffff68);
  sVar1 = std::
          map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
          ::size((map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
                  *)0x1aa577);
  this_02 = (__atomic_base<unsigned_long> *)((long)__k + (sVar1 - 1));
  this_00 = (map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             *)std::
               map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
               ::operator[](in_stack_ffffffffffffffa0,__k);
  std::shared_ptr<nuraft::log_entry>::operator=
            (in_stack_ffffffffffffff60,(shared_ptr<nuraft::log_entry> *)in_stack_ffffffffffffff58);
  _Var2 = std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffff68);
  if (_Var2 != 0) {
    timer_helper::get_timeofday_us();
    this_01 = (EventAwaiter *)(in_RDI + 0x78);
    p_Var4 = this_02;
    std::__atomic_base::operator_cast_to_unsigned_long(this_02);
    pmVar3 = std::
             map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::operator[](this_00,__k);
    *pmVar3 = (mapped_type)p_Var4;
    EventAwaiter::invoke(this_01);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1aa6a0);
  std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x1aa6ad);
  return (ulong)this_02;
}

Assistant:

ulong inmem_log_store::append(ptr<log_entry>& entry) {
    ptr<log_entry> clone = make_clone(entry);

    std::lock_guard<std::mutex> l(logs_lock_);
    size_t idx = start_idx_ + logs_.size() - 1;
    logs_[idx] = clone;

    if (disk_emul_delay) {
        uint64_t cur_time = timer_helper::get_timeofday_us();
        disk_emul_logs_being_written_[cur_time + disk_emul_delay * 1000] = idx;
        disk_emul_ea_.invoke();
    }

    return idx;
}